

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_pack(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  lua_State *L_00;
  TValue *pTVar3;
  long in_RDI;
  GCtab *t;
  MSize n;
  MSize i;
  TValue *base;
  TValue *array;
  lua_State *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar4;
  lua_State *L_01;
  
  L_01 = *(lua_State **)(in_RDI + 0x10);
  uVar2 = (uint)(*(long *)(in_RDI + 0x18) - (long)L_01 >> 3);
  L_00 = (lua_State *)
         lj_tab_new(in_stack_ffffffffffffff78,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  pTVar3 = lj_tab_setstr(L_01,(GCtab *)CONCAT44(in_stack_ffffffffffffff84,uVar2),(GCstr *)L_00);
  pTVar3->n = (double)(int)uVar2;
  uVar1 = (L_00->glref).ptr32;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    *(undefined8 *)((ulong)uVar1 + 8 + (ulong)uVar4 * 8) =
         *(undefined8 *)(&L_01->nextgc + (ulong)uVar4 * 2);
  }
  (L_01->nextgc).gcptr32 = (uint32_t)L_00;
  L_01->marked = 0xf4;
  L_01->gct = 0xff;
  L_01->dummy_ffid = 0xff;
  L_01->status = 0xff;
  *(MRef **)(in_RDI + 0x18) = &L_01->glref;
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x24) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x20)) {
    lj_gc_step(L_00);
  }
  return 1;
}

Assistant:

LJLIB_CF(table_pack)
{
  TValue *array, *base = L->base;
  MSize i, n = (uint32_t)(L->top - base);
  GCtab *t = lj_tab_new(L, n ? n+1 : 0, 1);
  /* NOBARRIER: The table is new (marked white). */
  setintV(lj_tab_setstr(L, t, strV(lj_lib_upvalue(L, 1))), (int32_t)n);
  for (array = tvref(t->array) + 1, i = 0; i < n; i++)
    copyTV(L, &array[i], &base[i]);
  settabV(L, base, t);
  L->top = base+1;
  lj_gc_check(L);
  return 1;
}